

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * GetIPChannel_abi_cxx11_(string *__return_storage_ptr__,Node *IOChannel,int InputFlag)

{
  bool bVar1;
  char *pcVar2;
  string sStack_68;
  string local_48;
  
  if (IOChannel != (Node *)0x0) {
    Node::NoParen_abi_cxx11_(&sStack_68,IOChannel);
    bVar1 = std::operator==(&sStack_68,"0");
    std::__cxx11::string::~string((string *)&sStack_68);
    if (!bVar1) {
      Node::Expression_abi_cxx11_(&local_48,IOChannel);
      std::operator+(&sStack_68,"BasicChannel[",&local_48);
      std::operator+(__return_storage_ptr__,&sStack_68,"]");
      std::__cxx11::string::~string((string *)&sStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      return __return_storage_ptr__;
    }
  }
  if (InputFlag == 0) {
    pcVar2 = "std::cout";
  }
  else {
    pcVar2 = "std::cin";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&sStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GetIPChannel(
	Node *IOChannel,	/**< IOChannel. May be zero */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Use default if no channel specified, else use
	// whatever is given
	//
	if ((IOChannel == 0) || (IOChannel->NoParen() == "0"))
	{
		if (InputFlag == 0)
		{
			return "std::cout";
		}
		else
		{
			return "std::cin";
		}
	}
	else
	{
		return "BasicChannel[" + IOChannel->Expression() + "]";
	}

}